

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void GetReplace(bitset<32UL> flags)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  unsigned_long uVar4;
  int iVar5;
  ulong uVar6;
  _WordT _Var7;
  ulong uVar8;
  
  if (t_assoc == set_associative) {
    if (t_replace != LRU) {
      if (t_replace == Random) {
        iVar5 = rand();
        auVar3._8_8_ = 0;
        auVar3._0_8_ = i_cache_set;
        temp = (ulong)(long)iVar5 /
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar3,0) + 1U);
        current_line = i_cache_set * current_set + temp;
      }
      goto LAB_00101c62;
    }
  }
  else {
    if (t_assoc != full_associative) goto LAB_00101c62;
    if (t_replace != LRU) {
      if (t_replace == Random) {
        iVar5 = rand();
        auVar2._8_8_ = 0;
        auVar2._0_8_ = i_num_line;
        current_line = (ulong)(long)iVar5 /
                       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar2,0) + 1U);
      }
      goto LAB_00101c62;
    }
  }
  LruUnhitUnspace();
LAB_00101c62:
  uVar4 = current_line;
  uVar6 = cache_item[current_line].super__Base_bitset<1UL>._M_w;
  if (((uint)uVar6 >> 0x1d & 1) != 0) {
    cache_item[current_line].super__Base_bitset<1UL>._M_w = uVar6 & 0xffffffff9fffffff;
  }
  i = 0x1f;
  uVar6 = 0x1f - (ulong)bit_tag;
  j = 0x1c;
  if (uVar6 < 0x1f) {
    _Var7 = cache_item[uVar4].super__Base_bitset<1UL>._M_w;
    do {
      uVar8 = _Var7 | 1L << (j & 0x3f);
      _Var7 = _Var7 & ~(1L << (j & 0x3f));
      if (((ulong)flags.super__Base_bitset<1UL>._M_w >> ((ulong)((int)j + 3U & 0xff) & 0x3f) & 1) !=
          0) {
        _Var7 = uVar8;
      }
      uVar8 = j + 2;
      j = j - 1;
    } while (uVar6 < uVar8);
    j = 0x1c - (ulong)bit_tag;
    cache_item[uVar4].super__Base_bitset<1UL>._M_w = _Var7;
    i = uVar6;
  }
  pbVar1 = (byte *)((long)&cache_item[uVar4].super__Base_bitset<1UL>._M_w + 3);
  *pbVar1 = *pbVar1 | 0x40;
  return;
}

Assistant:

void GetReplace(bitset<32> flags)
{
    if(t_assoc == direct_mapped)
    {
    }
    else if(t_assoc == full_associative)
    {
        if(t_replace == Random)
        {
            current_line = rand()/(RAND_MAX/i_num_line+1); // a random line in(0,i_num_line-1)
        }
        else if(t_replace == LRU)
        {
            LruUnhitUnspace();
        }
    }
    else if(t_assoc == set_associative) // 从本组中任选一行，进行替换
    {
        if(t_replace == Random)
        {
            temp = rand()/(RAND_MAX/i_cache_set+1); // a random line in(0,i_cache_set-1)
            current_line = current_set*i_cache_set+temp; // a random line in current_set
        }
        else if(t_replace == LRU)
        {
            LruUnhitUnspace();
        }
    }

    if(cache_item[current_line][29]) //dirty位必须为1才写入
    {
        GetWrite(); //写入内存
    }

#ifndef NDEBUG
    cout << "Read from Main Memory to Cache: " << endl;
#endif // NDEBUG

    for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //设置标记
    {
        cache_item[current_line][j] = flags[i];
        assert(j>0);
    }

    cache_item[current_line][30] = true; //设置hit位为true
}